

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_bool32 drwav__seek_forward(drwav_seek_proc onSeek,drwav_uint64 offset,void *pUserData)

{
  int iVar1;
  undefined8 in_RDX;
  ulong in_RSI;
  code *in_RDI;
  drwav_uint64 bytesRemainingToSeek;
  ulong local_28;
  
  local_28 = in_RSI;
  while( true ) {
    while( true ) {
      if (local_28 == 0) {
        return 1;
      }
      if (local_28 < 0x80000000) break;
      iVar1 = (*in_RDI)(in_RDX,0x7fffffff,1);
      if (iVar1 == 0) {
        return 0;
      }
      local_28 = local_28 - 0x7fffffff;
    }
    iVar1 = (*in_RDI)(in_RDX,local_28 & 0xffffffff,1);
    if (iVar1 == 0) break;
    local_28 = 0;
  }
  return 0;
}

Assistant:

static drwav_bool32 drwav__seek_forward(drwav_seek_proc onSeek, drwav_uint64 offset, void* pUserData)
{
    drwav_uint64 bytesRemainingToSeek = offset;
    while (bytesRemainingToSeek > 0) {
        if (bytesRemainingToSeek > 0x7FFFFFFF) {
            if (!onSeek(pUserData, 0x7FFFFFFF, drwav_seek_origin_current)) {
                return DRWAV_FALSE;
            }
            bytesRemainingToSeek -= 0x7FFFFFFF;
        } else {
            if (!onSeek(pUserData, (int)bytesRemainingToSeek, drwav_seek_origin_current)) {
                return DRWAV_FALSE;
            }
            bytesRemainingToSeek = 0;
        }
    }

    return DRWAV_TRUE;
}